

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O3

string * __thiscall
QPDFCrypto_openssl::SHA2_digest_abi_cxx11_(string *__return_storage_ptr__,QPDFCrypto_openssl *this)

{
  ulong uVar1;
  
  uVar1 = this->sha2_bits;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this->md_out,this->md_out + (uVar1 >> 3));
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFCrypto_openssl::SHA2_digest()
{
    return {reinterpret_cast<char*>(md_out), sha2_bits / 8};
}